

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O3

int is_static_var(sm_ref expr)

{
  for (; expr->node_type == cod_identifier; expr = (expr->node).declaration.freeable_complex_type) {
  }
  if (expr->node_type == cod_declaration) {
    return (expr->node).declaration.static_var;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/ffs/ffs/cod/cg.c"
                ,0xa03,"int is_static_var(sm_ref)");
}

Assistant:

static int 
is_static_var(sm_ref expr)
{
    if (expr->node_type == cod_identifier) {
	return is_static_var(expr->node.identifier.sm_declaration);
    } else if (expr->node_type == cod_declaration) {
	return expr->node.declaration.static_var;
    } else {
	assert(0);
    }
    return 0;
}